

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_table.c
# Opt level: O3

apx_error_t
apx_portConnectorChangeTable_create(apx_portConnectorChangeTable_t *self,apx_size_t num_ports)

{
  apx_portConnectorChangeEntry_t *paVar1;
  ulong uVar2;
  apx_error_t aVar3;
  long lVar4;
  
  aVar3 = 1;
  if (num_ports != 0 && self != (apx_portConnectorChangeTable_t *)0x0) {
    self->num_ports = num_ports;
    paVar1 = (apx_portConnectorChangeEntry_t *)malloc((ulong)num_ports << 4);
    self->entries = paVar1;
    if (paVar1 == (apx_portConnectorChangeEntry_t *)0x0) {
      aVar3 = 2;
    }
    else {
      aVar3 = 0;
      lVar4 = 0;
      uVar2 = 0;
      do {
        apx_portConnectorChangeEntry_create
                  ((apx_portConnectorChangeEntry_t *)((long)&self->entries->count + lVar4));
        uVar2 = uVar2 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar2 < self->num_ports);
    }
  }
  return aVar3;
}

Assistant:

apx_error_t apx_portConnectorChangeTable_create(apx_portConnectorChangeTable_t *self, apx_size_t num_ports)
{
   if ( (self != NULL) && (num_ports > 0) )
   {
      apx_size_t i;
      self->num_ports = num_ports;
      self->entries = (apx_portConnectorChangeEntry_t*) malloc(sizeof(apx_portConnectorChangeEntry_t)*num_ports);
      if (self->entries == 0)
      {
         return APX_MEM_ERROR;
      }
      for (i=0; i<self->num_ports; i++)
      {
         apx_portConnectorChangeEntry_create(&self->entries[i]);
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}